

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datarate_test.cc
# Opt level: O3

void __thiscall
datarate_test::anon_unknown_0::DatarateTestLarge::BasicRateTargetingSuperresCBR
          (DatarateTestLarge *this)

{
  DatarateTest *pDVar1;
  bool bVar2;
  aom_rational aVar3;
  ParamType *pPVar4;
  undefined8 *puVar5;
  pointer *__ptr;
  SEARCH_METHODS *pSVar6;
  AssertHelper local_a8;
  AssertHelper local_a0;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  I420VideoSource video;
  
  gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
  _vptr_TestPartResultReporterInterface =
       (_func_int **)&gtest_fatal_failure_checker.original_reporter_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_fatal_failure_checker,"desktopqvga2.320_240.yuv","");
  libaom_test::YUVVideoSource::YUVVideoSource
            (&video.super_YUVVideoSource,(string *)&gtest_fatal_failure_checker,AOM_IMG_FMT_I420,
             0x140,0xf0,0x1e,1,0,800);
  video.super_YUVVideoSource.super_VideoSource._vptr_VideoSource =
       (_func_int **)&PTR__YUVVideoSource_01003b10;
  if ((TestPartResultReporterInterface **)
      gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != &gtest_fatal_failure_checker.original_reporter_) {
    operator_delete(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface);
  }
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_profile = 0;
  aVar3.den = video.super_YUVVideoSource.framerate_numerator_;
  aVar3.num = video.super_YUVVideoSource.framerate_denominator_;
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_timebase = aVar3;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_optimal_sz = 500;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_sz = 1000;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_initial_sz = 500;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_dropframe_thresh = 1;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_min_quantizer = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_max_quantizer = 0x3f;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_end_usage = AOM_CBR;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_superres_mode = AOM_SUPERRES_FIXED;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_superres_denominator = 0x10;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_superres_kf_denominator = 0x10;
  pPVar4 = testing::
           WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
           ::GetParam();
  pDVar1 = &this->super_DatarateTest;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate =
       *(uint *)(&DAT_00c4aa38 +
                (long)(pPVar4->
                      super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                      ).super__Tuple_impl<1UL,_libaom_test::TestMode,_int,_unsigned_int,_int>.
                      super__Tuple_impl<2UL,_int,_unsigned_int,_int>.
                      super__Tuple_impl<3UL,_unsigned_int,_int>.super__Tuple_impl<4UL,_int>.
                      super__Head_base<4UL,_int,_false>._M_head_impl * 4);
  (*(this->super_DatarateTest).super_EncoderTest._vptr_EncoderTest[0x13])(pDVar1);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      (*(pDVar1->super_EncoderTest)._vptr_EncoderTest[2])(pDVar1,&video);
    }
    bVar2 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar2 == false) {
      local_a8.data_ =
           (AssertHelperData *)
           (double)(this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate;
      local_a0.data_ = (AssertHelperData *)((this->super_DatarateTest).effective_datarate_ * 0.85);
      testing::internal::CmpHelperGE<double,double>
                ((internal *)&gtest_fatal_failure_checker,
                 "static_cast<double>(cfg_.rc_target_bitrate)","effective_datarate_ * 0.85",
                 (double *)&local_a8,(double *)&local_a0);
      if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                _vptr_TestPartResultReporterInterface == '\0') {
        testing::Message::Message((Message *)&local_a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_a8.data_)->line,
                   " The datarate for the file exceeds the target by too much!",0x3a);
        if ((undefined8 *)
            CONCAT71(gtest_fatal_failure_checker._9_7_,
                     gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
          pSVar6 = "";
        }
        else {
          pSVar6 = *(SEARCH_METHODS **)
                    CONCAT71(gtest_fatal_failure_checker._9_7_,
                             gtest_fatal_failure_checker.has_new_fatal_failure_);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/datarate_test.cc"
                   ,0x18d,(char *)pSVar6);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if (local_a8.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_a8.data_ + 8))();
        }
        puVar5 = (undefined8 *)
                 CONCAT71(gtest_fatal_failure_checker._9_7_,
                          gtest_fatal_failure_checker.has_new_fatal_failure_);
        if (puVar5 == (undefined8 *)0x0) goto LAB_005eaeba;
        if ((undefined8 *)*puVar5 != puVar5 + 2) {
          operator_delete((undefined8 *)*puVar5);
        }
      }
      else {
        puVar5 = (undefined8 *)
                 CONCAT71(gtest_fatal_failure_checker._9_7_,
                          gtest_fatal_failure_checker.has_new_fatal_failure_);
        if (puVar5 != (undefined8 *)0x0) {
          if ((undefined8 *)*puVar5 != puVar5 + 2) {
            operator_delete((undefined8 *)*puVar5);
          }
          operator_delete(puVar5);
        }
        local_a8.data_ =
             (AssertHelperData *)
             (double)(this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate;
        local_a0.data_ = (AssertHelperData *)((this->super_DatarateTest).effective_datarate_ * 1.15)
        ;
        testing::internal::CmpHelperLE<double,double>
                  ((internal *)&gtest_fatal_failure_checker,
                   "static_cast<double>(cfg_.rc_target_bitrate)","effective_datarate_ * 1.15",
                   (double *)&local_a8,(double *)&local_a0);
        if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface == '\0') {
          testing::Message::Message((Message *)&local_a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_a8.data_)->line,
                     " The datarate for the file missed the target!",0x2d);
          std::ostream::_M_insert<unsigned_long>((ulong)&(local_a8.data_)->line);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_a8.data_)->line," ",1);
          std::ostream::_M_insert<double>((this->super_DatarateTest).effective_datarate_);
          if ((undefined8 *)
              CONCAT71(gtest_fatal_failure_checker._9_7_,
                       gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
            pSVar6 = "";
          }
          else {
            pSVar6 = *(SEARCH_METHODS **)
                      CONCAT71(gtest_fatal_failure_checker._9_7_,
                               gtest_fatal_failure_checker.has_new_fatal_failure_);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/datarate_test.cc"
                     ,400,(char *)pSVar6);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_a8.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_a8.data_ + 8))();
          }
        }
        puVar5 = (undefined8 *)
                 CONCAT71(gtest_fatal_failure_checker._9_7_,
                          gtest_fatal_failure_checker.has_new_fatal_failure_);
        if (puVar5 == (undefined8 *)0x0) goto LAB_005eaeba;
        if ((undefined8 *)*puVar5 != puVar5 + 2) {
          operator_delete((undefined8 *)*puVar5);
        }
      }
      operator_delete(puVar5);
      goto LAB_005eaeba;
    }
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&local_a8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/datarate_test.cc"
             ,0x18b,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&local_a8);
  if (gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != (_func_int **)0x0) {
    (**(code **)(*gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface + 8))();
  }
LAB_005eaeba:
  libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
  return;
}

Assistant:

virtual void BasicRateTargetingSuperresCBR() {
    ::libaom_test::I420VideoSource video("desktopqvga2.320_240.yuv", 320, 240,
                                         30, 1, 0, 800);

    cfg_.g_profile = 0;
    cfg_.g_timebase = video.timebase();

    cfg_.rc_buf_initial_sz = 500;
    cfg_.rc_buf_optimal_sz = 500;
    cfg_.rc_buf_sz = 1000;
    cfg_.rc_dropframe_thresh = 1;
    cfg_.rc_min_quantizer = 0;
    cfg_.rc_max_quantizer = 63;
    cfg_.rc_end_usage = AOM_CBR;

    cfg_.rc_superres_mode = AOM_SUPERRES_FIXED;
    cfg_.rc_superres_denominator = 16;
    cfg_.rc_superres_kf_denominator = 16;

    const int bitrate_array[2] = { 250, 650 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    ResetModel();
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    ASSERT_GE(static_cast<double>(cfg_.rc_target_bitrate),
              effective_datarate_ * 0.85)
        << " The datarate for the file exceeds the target by too much!";
    ASSERT_LE(static_cast<double>(cfg_.rc_target_bitrate),
              effective_datarate_ * 1.15)
        << " The datarate for the file missed the target!"
        << cfg_.rc_target_bitrate << " " << effective_datarate_;
  }